

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_metadata_info.cpp
# Opt level: O1

void duckdb::PragmaMetadataInfoFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  FunctionData *pFVar1;
  unsigned_long *puVar2;
  const_reference pvVar3;
  long lVar4;
  _func_int **__n;
  unsigned_long *puVar5;
  idx_t iVar6;
  ulong index;
  bool bVar7;
  vector<duckdb::Value,_true> list_values;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  GlobalTableFunctionState *local_b8;
  vector<duckdb::MetadataBlockInfo,_true> *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  Value local_88;
  LogicalType local_48;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&data_p->bind_data);
  pFVar1 = (data_p->bind_data).ptr;
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  local_b8 = (data_p->global_state).ptr;
  __n = local_b8[1]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)
            (((long)pFVar1[5]._vptr_FunctionData - (long)pFVar1[4]._vptr_FunctionData >> 3) *
            -0x3333333333333333)) {
    local_b0 = (vector<duckdb::MetadataBlockInfo,_true> *)(pFVar1 + 4);
    index = 0;
    do {
      local_b8[1]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
      pvVar3 = vector<duckdb::MetadataBlockInfo,_true>::operator[](local_b0,(size_type)__n);
      Value::BIGINT(&local_88,pvVar3->block_id);
      DataChunk::SetValue(output,0,index,&local_88);
      Value::~Value(&local_88);
      lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar3->total_blocks);
      Value::BIGINT(&local_88,lVar4);
      DataChunk::SetValue(output,1,index,&local_88);
      Value::~Value(&local_88);
      lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                        ((long)(pvVar3->free_list).
                               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar3->free_list).
                               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3);
      Value::BIGINT(&local_88,lVar4);
      DataChunk::SetValue(output,2,index,&local_88);
      Value::~Value(&local_88);
      local_d8 = 0;
      uStack_d0 = 0;
      local_c8 = 0;
      puVar2 = (pvVar3->free_list).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar5 = (pvVar3->free_list).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
        lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert(*puVar5);
        Value::BIGINT(&local_88,lVar4);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_d8,&local_88);
        Value::~Value(&local_88);
      }
      LogicalType::LogicalType(&local_48,BIGINT);
      local_a8 = local_d8;
      uStack_a0 = uStack_d0;
      local_98 = local_c8;
      local_d8 = 0;
      uStack_d0 = 0;
      local_c8 = 0;
      Value::LIST(&local_88,&local_48,(vector<duckdb::Value,_true> *)&local_a8);
      DataChunk::SetValue(output,3,index,&local_88);
      Value::~Value(&local_88);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_a8);
      LogicalType::~LogicalType(&local_48);
      iVar6 = index + 1;
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_d8);
      __n = local_b8[1]._vptr_GlobalTableFunctionState;
    } while ((__n < (_func_int **)
                    (((long)pFVar1[5]._vptr_FunctionData - (long)pFVar1[4]._vptr_FunctionData >> 3)
                    * -0x3333333333333333)) && (bVar7 = index < 0x7ff, index = iVar6, bVar7));
  }
  else {
    iVar6 = 0;
  }
  output->count = iVar6;
  return;
}

Assistant:

static void PragmaMetadataInfoFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &bind_data = data_p.bind_data->Cast<PragmaMetadataFunctionData>();
	auto &data = data_p.global_state->Cast<PragmaMetadataOperatorData>();
	idx_t count = 0;
	while (data.offset < bind_data.metadata_info.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = bind_data.metadata_info[data.offset++];

		idx_t col_idx = 0;
		// block_id
		output.SetValue(col_idx++, count, Value::BIGINT(entry.block_id));
		// total_blocks
		output.SetValue(col_idx++, count, Value::BIGINT(NumericCast<int64_t>(entry.total_blocks)));
		// free_blocks
		output.SetValue(col_idx++, count, Value::BIGINT(NumericCast<int64_t>(entry.free_list.size())));
		// free_list
		vector<Value> list_values;
		for (auto &free_id : entry.free_list) {
			list_values.push_back(Value::BIGINT(NumericCast<int64_t>(free_id)));
		}
		output.SetValue(col_idx++, count, Value::LIST(LogicalType::BIGINT, std::move(list_values)));
		count++;
	}
	output.SetCardinality(count);
}